

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

void testExistingStreams(string *tempDir)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar1;
  void *this;
  exception *e;
  Array2D<Imf_3_4::Rgba> p1;
  int compression;
  int H;
  int W;
  Array2D<Imf_3_4::Rgba> *in_stack_00000408;
  int in_stack_00000410;
  int in_stack_00000414;
  Array2D<Imf_3_4::Rgba> *in_stack_00000438;
  int in_stack_00000440;
  int in_stack_00000444;
  Array2D<Imf_3_4::Rgba> *in_stack_00000658;
  Compression in_stack_00000664;
  int in_stack_00000668;
  int in_stack_0000066c;
  char *in_stack_00000670;
  Array2D<Imf_3_4::Rgba> *in_stack_00000798;
  int in_stack_000007a0;
  int in_stack_000007a4;
  Array2D<Imf_3_4::Rgba> *in_stack_00000808;
  Compression in_stack_00000814;
  int in_stack_00000818;
  int in_stack_0000081c;
  char *in_stack_00000820;
  Array2D<Imf_3_4::Rgba> *in_stack_00000b18;
  Compression in_stack_00000b24;
  int in_stack_00000b28;
  int in_stack_00000b2c;
  char *in_stack_00000b30;
  Array2D<Imf_3_4::Rgba> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Array2D<Imf_3_4::Rgba> *in_stack_ffffffffffffff40;
  string local_98 [8];
  long in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff78;
  Array2D<Imf_3_4::Rgba> *in_stack_ffffffffffffff80;
  string local_78 [32];
  string local_58 [56];
  int local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<((ostream *)&std::cout,"Testing reading and writing using existing streams"
                         );
  std::ostream::operator<<(__lhs,std::endl<char,std::char_traits<char>>);
  local_18 = 0x77;
  local_1c = 0xed;
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"compression: ");
    this = (void *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    anon_unknown.dwarf_f3d98::fillPixels1
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    std::operator+(__lhs,(char *)poVar1);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_f3d98::writeReadScanLines
              (in_stack_00000820,in_stack_0000081c,in_stack_00000818,in_stack_00000814,
               in_stack_00000808);
    std::__cxx11::string::~string(local_58);
    anon_unknown.dwarf_f3d98::writeReadScanLines
              (in_stack_00000414,in_stack_00000410,in_stack_00000408);
    anon_unknown.dwarf_f3d98::fillPixels2
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    std::operator+(__lhs,(char *)poVar1);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_f3d98::writeReadTiles
              (in_stack_00000670,in_stack_0000066c,in_stack_00000668,in_stack_00000664,
               in_stack_00000658);
    std::__cxx11::string::~string(local_78);
    anon_unknown.dwarf_f3d98::writeReadTiles(in_stack_00000444,in_stack_00000440,in_stack_00000438);
    anon_unknown.dwarf_f3d98::fillPixels1
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    std::operator+(__lhs,(char *)poVar1);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_f3d98::writeReadMultiPart
              (in_stack_00000b30,in_stack_00000b2c,in_stack_00000b28,in_stack_00000b24,
               in_stack_00000b18);
    std::__cxx11::string::~string(local_98);
    anon_unknown.dwarf_f3d98::writeReadMultiPart
              (in_stack_000007a4,in_stack_000007a0,in_stack_00000798);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(in_stack_ffffffffffffff30);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
                (tempDir + "imf_test_streams.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
                (tempDir + "imf_test_streams2.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
                (tempDir + "imf_test_streams3.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}